

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int coda_inflateGetDictionary(z_streamp strm,Bytef *dictionary,uInt *dictLength)

{
  internal_state *piVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = inflateStateCheck(strm);
  iVar3 = -2;
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (dictionary != (Bytef *)0x0 && *(int *)(piVar1 + 0x40) != 0) {
      memcpy(dictionary,(void *)((ulong)*(uint *)(piVar1 + 0x44) + *(long *)(piVar1 + 0x48)),
             (ulong)(*(int *)(piVar1 + 0x40) - *(uint *)(piVar1 + 0x44)));
      memcpy(dictionary + ((ulong)*(uint *)(piVar1 + 0x40) - (ulong)*(uint *)(piVar1 + 0x44)),
             *(void **)(piVar1 + 0x48),(ulong)*(uint *)(piVar1 + 0x44));
    }
    iVar3 = 0;
    if (dictLength != (uInt *)0x0) {
      *dictLength = *(uInt *)(piVar1 + 0x40);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int ZEXPORT inflateGetDictionary(z_streamp strm, Bytef *dictionary,
                                 uInt *dictLength) {
    struct inflate_state FAR *state;

    /* check state */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* copy dictionary */
    if (state->whave && dictionary != Z_NULL) {
        zmemcpy(dictionary, state->window + state->wnext,
                state->whave - state->wnext);
        zmemcpy(dictionary + state->whave - state->wnext,
                state->window, state->wnext);
    }
    if (dictLength != Z_NULL)
        *dictLength = state->whave;
    return Z_OK;
}